

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

void __thiscall BMP::buildingCodeShannonFano(BMP *this,char lit,string *code,int left,int right)

{
  Alphabet *pAVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int right_00;
  longdouble lVar6;
  longdouble lVar7;
  string local_70;
  string local_50;
  
  if ((byte)(lit - 0x32U) < 0xfe) {
    std::__cxx11::string::assign((char *)code);
  }
  else {
    std::__cxx11::string::push_back((char)code);
  }
  pAVar1 = this->alphabet;
  if (left == right) {
    std::__cxx11::string::_M_assign((string *)&pAVar1->symbol[left].codeShannonFano);
    return;
  }
  lVar2 = (long)left;
  lVar4 = lVar2 * 0x80 + 0x10;
  lVar6 = (longdouble)0;
  for (lVar5 = lVar2; lVar5 < right; lVar5 = lVar5 + 1) {
    lVar6 = *(longdouble *)((long)&pAVar1->symbol->num + lVar4) + lVar6;
    lVar4 = lVar4 + 0x80;
  }
  right_00 = left;
  if (left < right) {
    right_00 = right;
  }
  uVar3 = lVar2 * 0x80 | 0x10;
  lVar7 = (longdouble)0;
  do {
    if (right <= lVar2) {
LAB_00102ed8:
      std::__cxx11::string::string((string *)&local_50,(string *)code);
      buildingCodeShannonFano(this,'1',&local_50,left,right_00);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_70,(string *)code);
      buildingCodeShannonFano(this,'0',&local_70,right_00 + 1,right);
      std::__cxx11::string::~string((string *)&local_70);
      return;
    }
    lVar7 = *(longdouble *)((long)&pAVar1->symbol->num + uVar3) + lVar7;
    if (lVar6 * (longdouble)0.5 <= lVar7) {
      right_00 = (int)lVar2;
      goto LAB_00102ed8;
    }
    lVar2 = lVar2 + 1;
    uVar3 = uVar3 + 0x80;
  } while( true );
}

Assistant:

void BMP::buildingCodeShannonFano(char lit, std::string code, int left, int right)
{
    if ( lit != '1' && lit != '0' ) {
        code = "";
    } else {
        code += lit;
    }

    if ( left == right ) {
        alphabet->symbol[ left ].codeShannonFano = code;
    } else {
        long double midFrq = 0;
        int medium         = left;
        long double temp   = 0;

        for ( auto i = left; i < right; i++ ){
            midFrq += alphabet->symbol[ i ].frq;
        }

        midFrq /= 2;

        while ( medium < right && temp + alphabet->symbol[ medium ].frq < midFrq){
            temp += alphabet->symbol[ medium ].frq;
            medium++;
        }

        buildingCodeShannonFano( '1', code, left, medium );
        buildingCodeShannonFano( '0', code, medium + 1, right );
    }
}